

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<short,_true,_short>::BitpackingWriter::WriteConstantDelta
               (short constant,short frame_of_reference,idx_t count,short *values,bool *validity,
               void *data_ptr)

{
  short *psVar1;
  
  ReserveSpace((BitpackingCompressionState<short,_true,_short> *)data_ptr,4);
  WriteMetaData((BitpackingCompressionState<short,_true,_short> *)data_ptr,CONSTANT_DELTA);
  psVar1 = *(short **)((long)data_ptr + 0x40);
  *psVar1 = frame_of_reference;
  psVar1[1] = constant;
  *(short **)((long)data_ptr + 0x40) = psVar1 + 2;
  UpdateStats((BitpackingCompressionState<short,_true,_short> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstantDelta(T_S constant, T frame_of_reference, idx_t count, T *values, bool *validity,
		                               void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, 2 * sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT_DELTA);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}